

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-value.c
# Opt level: O0

void test_array_insert(void)

{
  int32_t iVar1;
  VALUE *pVVar2;
  size_t sVar3;
  int i;
  VALUE *v;
  VALUE a;
  int N;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar4;
  VALUE *in_stack_ffffffffffffffe0;
  VALUE *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 uVar5;
  
  uVar5 = 100000;
  value_init_array((VALUE *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  pVVar2 = value_array_append(in_stack_ffffffffffffffe0);
  value_init_int32((VALUE *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
  pVVar2 = value_array_append(pVVar2);
  value_init_int32((VALUE *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
  for (iVar4 = 0; iVar4 < 100000; iVar4 = iVar4 + 1) {
    pVVar2 = value_array_insert(in_stack_ffffffffffffffe8,(size_t)pVVar2);
    value_init_int32((VALUE *)CONCAT44(iVar4,in_stack_ffffffffffffffd8),0);
  }
  sVar3 = value_array_size((VALUE *)CONCAT44(iVar4,in_stack_ffffffffffffffd8));
  acutest_check_((int)(ulong)(sVar3 == 0x186a2),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x2d5,"%s","value_array_size(&a) == N + 2");
  for (iVar4 = 0; iVar4 < 0x186a2; iVar4 = iVar4 + 1) {
    pVVar2 = value_array_get(in_stack_ffffffffffffffe8,(size_t)pVVar2);
    iVar1 = value_int32((VALUE *)CONCAT44(uVar5,in_stack_fffffffffffffff8));
    acutest_check_((int)(ulong)(iVar1 == iVar4 + -1),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                   ,0x2d8,"%s","value_int32(v) == i - 1");
  }
  value_fini((VALUE *)0x10b892);
  return;
}

Assistant:

static void
test_array_insert(void)
{
    const int N = 100000;

    VALUE a;
    VALUE* v;
    int i;

    value_init_array(&a);
    v = value_array_append(&a);
    value_init_int32(v, -1);
    v = value_array_append(&a);
    value_init_int32(v, N);
    for(i = 0; i < N; i++) {
        v = value_array_insert(&a, i + 1);
        value_init_int32(v, i);
    }
    TEST_CHECK(value_array_size(&a) == N + 2);
    for(i = 0; i < N + 2; i++) {
        v = value_array_get(&a, i);
        TEST_CHECK(value_int32(v) == i - 1);
    }
    value_fini(&a);
}